

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

int mpz_set_str(__mpz_struct *r,char *sp,int base)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  mp_ptr rp_00;
  void *sn_00;
  mp_ptr pmVar5;
  mp_size_t mVar6;
  uint in_EDX;
  byte *in_RSI;
  int *in_RDI;
  mpn_base_info info;
  uint digit;
  uchar *dp;
  int sign;
  size_t sn;
  size_t dn;
  mp_ptr rp;
  mp_size_t alloc;
  mp_size_t rn;
  uint value_of_a;
  uint bits;
  int local_90;
  mp_size_t in_stack_ffffffffffffff78;
  __mpz_struct *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  mpn_base_info *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  long local_48;
  int local_30;
  uint local_1c;
  byte *local_18;
  int local_4;
  
  local_18 = in_RSI;
  while (iVar1 = isspace((uint)*local_18), iVar1 != 0) {
    local_18 = local_18 + 1;
  }
  uVar2 = (uint)(*local_18 == 0x2d);
  local_18 = local_18 + (int)uVar2;
  local_1c = in_EDX;
  if (in_EDX == 0) {
    if (*local_18 == 0x30) {
      if ((local_18[1] == 0x78) || (local_18[1] == 0x58)) {
        local_1c = 0x10;
        local_18 = local_18 + 2;
      }
      else if ((local_18[1] == 0x62) || (local_18[1] == 0x42)) {
        local_1c = 2;
        local_18 = local_18 + 2;
      }
      else {
        local_1c = 8;
      }
    }
    else {
      local_1c = 10;
    }
  }
  if (*local_18 == 0) {
    in_RDI[1] = 0;
    local_4 = -1;
  }
  else {
    rp_00 = (mp_ptr)strlen((char *)local_18);
    sn_00 = (*gmp_allocate_func)((size_t)rp_00);
    iVar1 = 10;
    if (0x24 < (int)local_1c) {
      iVar1 = 0x24;
    }
    local_48 = 0;
    for (; *local_18 != 0; local_18 = local_18 + 1) {
      iVar3 = isspace((uint)*local_18);
      if (iVar3 == 0) {
        if (((char)*local_18 < '0') || ('9' < (char)*local_18)) {
          if (((char)*local_18 < 'a') || ('z' < (char)*local_18)) {
            in_stack_ffffffffffffff9c = local_1c;
            if (('@' < (char)*local_18) && ((char)*local_18 < '[')) {
              in_stack_ffffffffffffff9c = (int)(char)*local_18 - 0x37;
            }
          }
          else {
            in_stack_ffffffffffffff9c = (char)*local_18 + -0x61 + iVar1;
          }
        }
        else {
          in_stack_ffffffffffffff9c = (int)(char)*local_18 - 0x30;
        }
        if (local_1c <= in_stack_ffffffffffffff9c) {
          (*gmp_free_func)(sn_00,(size_t)rp_00);
          in_RDI[1] = 0;
          return -1;
        }
        *(char *)((long)sn_00 + local_48) = (char)in_stack_ffffffffffffff9c;
        local_48 = local_48 + 1;
      }
    }
    if (local_48 == 0) {
      (*gmp_free_func)(sn_00,(size_t)rp_00);
      in_RDI[1] = 0;
      local_4 = -1;
    }
    else {
      uVar4 = mpn_base_power_of_two_p(local_1c);
      if (uVar4 == 0) {
        mpn_get_base_info((mpn_base_info *)&stack0xffffffffffffff88,(long)(int)local_1c);
        if ((long)*in_RDI <
            (long)(((local_48 + (ulong)in_stack_ffffffffffffff88) - 1) /
                  (ulong)in_stack_ffffffffffffff88)) {
          pmVar5 = mpz_realloc(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
        else {
          pmVar5 = *(mp_ptr *)(in_RDI + 2);
        }
        mVar6 = mpn_set_str_other(rp_00,(uchar *)CONCAT44(uVar2,in_stack_ffffffffffffffa8),
                                  (size_t)sn_00,
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                  in_stack_ffffffffffffff90);
        local_30 = (int)mVar6 - (uint)(pmVar5[mVar6 + -1] == 0);
      }
      else {
        if ((long)*in_RDI < (long)(local_48 * (ulong)uVar4 + 0x3f >> 6)) {
          pmVar5 = mpz_realloc(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
        else {
          pmVar5 = *(mp_ptr *)(in_RDI + 2);
        }
        mVar6 = mpn_set_str_bits((mp_ptr)in_stack_ffffffffffffff90,
                                 (uchar *)CONCAT44(in_stack_ffffffffffffff8c,
                                                   in_stack_ffffffffffffff88),(size_t)pmVar5,
                                 (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        local_30 = (int)mVar6;
      }
      (*gmp_free_func)(sn_00,(size_t)rp_00);
      local_90 = local_30;
      if (uVar2 != 0) {
        local_90 = -local_30;
      }
      in_RDI[1] = local_90;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
mpz_set_str (mpz_t r, const char *sp, int base)
{
  unsigned bits, value_of_a;
  mp_size_t rn, alloc;
  mp_ptr rp;
  size_t dn, sn;
  int sign;
  unsigned char *dp;

  assert (base == 0 || (base >= 2 && base <= 62));

  while (isspace( (unsigned char) *sp))
    sp++;

  sign = (*sp == '-');
  sp += sign;

  if (base == 0)
    {
      if (sp[0] == '0')
	{
	  if (sp[1] == 'x' || sp[1] == 'X')
	    {
	      base = 16;
	      sp += 2;
	    }
	  else if (sp[1] == 'b' || sp[1] == 'B')
	    {
	      base = 2;
	      sp += 2;
	    }
	  else
	    base = 8;
	}
      else
	base = 10;
    }

  if (!*sp)
    {
      r->_mp_size = 0;
      return -1;
    }
  sn = strlen(sp);
  dp = (unsigned char *) gmp_alloc (sn);

  value_of_a = (base > 36) ? 36 : 10;
  for (dn = 0; *sp; sp++)
    {
      unsigned digit;

      if (isspace ((unsigned char) *sp))
	continue;
      else if (*sp >= '0' && *sp <= '9')
	digit = *sp - '0';
      else if (*sp >= 'a' && *sp <= 'z')
	digit = *sp - 'a' + value_of_a;
      else if (*sp >= 'A' && *sp <= 'Z')
	digit = *sp - 'A' + 10;
      else
	digit = base; /* fail */

      if (digit >= (unsigned) base)
	{
	  gmp_free (dp, sn);
	  r->_mp_size = 0;
	  return -1;
	}

      dp[dn++] = digit;
    }

  if (!dn)
    {
      gmp_free (dp, sn);
      r->_mp_size = 0;
      return -1;
    }
  bits = mpn_base_power_of_two_p (base);

  if (bits > 0)
    {
      alloc = (dn * bits + GMP_LIMB_BITS - 1) / GMP_LIMB_BITS;
      rp = MPZ_REALLOC (r, alloc);
      rn = mpn_set_str_bits (rp, dp, dn, bits);
    }
  else
    {
      struct mpn_base_info info;
      mpn_get_base_info (&info, base);
      alloc = (dn + info.exp - 1) / info.exp;
      rp = MPZ_REALLOC (r, alloc);
      rn = mpn_set_str_other (rp, dp, dn, base, &info);
      /* Normalization, needed for all-zero input. */
      assert (rn > 0);
      rn -= rp[rn-1] == 0;
    }
  assert (rn <= alloc);
  gmp_free (dp, sn);

  r->_mp_size = sign ? - rn : rn;

  return 0;
}